

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Class_Statements(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
                   *this,string *t_class_name)

{
  undefined1 uVar1;
  bool bVar2;
  eval_error *this_00;
  element_type *t_fname;
  File_Position local_84;
  allocator<char> local_79;
  string local_78;
  undefined8 uStack_48;
  Position start;
  bool saw_eol;
  bool has_more;
  bool retval;
  Depth_Counter dc;
  string *t_class_name_local;
  ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  dc.parser = (ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
               *)t_class_name;
  Depth_Counter::Depth_Counter((Depth_Counter *)&stack0xffffffffffffffe0,this);
  start._31_1_ = 0;
  start._30_1_ = 1;
  start._29_1_ = 1;
  while( true ) {
    while( true ) {
      uVar1 = start._31_1_;
      if (start._30_1_ == '\0') {
        Depth_Counter::~Depth_Counter((Depth_Counter *)&stack0xffffffffffffffe0);
        return (bool)(uVar1 & 1);
      }
      uStack_48._0_4_ = (this->m_position).line;
      uStack_48._4_4_ = (this->m_position).col;
      start._0_8_ = (this->m_position).m_pos;
      start.m_pos = (this->m_position).m_end;
      start.m_end = *(char **)&(this->m_position).m_last_col;
      bVar2 = Def(this,true,(string *)dc.parser);
      if ((bVar2) || (bVar2 = Var_Decl(this,true,(string *)dc.parser), bVar2)) break;
      start._30_1_ = Eol(this);
      if ((bool)start._30_1_) {
        start._31_1_ = 1;
        start._29_1_ = 1;
      }
    }
    if ((start._29_1_ & 1) == 0) break;
    start._30_1_ = 1;
    start._31_1_ = 1;
    start._29_1_ = 1;
  }
  this_00 = (eval_error *)__cxa_allocate_exception(0x90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Two function definitions missing line separator",&local_79);
  File_Position::File_Position(&local_84,(int)uStack_48,uStack_48._4_4_);
  t_fname = Catch::clara::std::
            __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_filename);
  exception::eval_error::eval_error(this_00,&local_78,&local_84,t_fname);
  __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
}

Assistant:

bool Class_Statements(const std::string &t_class_name) {
        Depth_Counter dc{this};
        bool retval = false;

        bool has_more = true;
        bool saw_eol = true;

        while (has_more) {
          const auto start = m_position;
          if (Def(true, t_class_name) || Var_Decl(true, t_class_name)) {
            if (!saw_eol) {
              throw exception::eval_error("Two function definitions missing line separator",
                                          File_Position(start.line, start.col),
                                          *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = true;
          } else if (Eol()) {
            has_more = true;
            retval = true;
            saw_eol = true;
          } else {
            has_more = false;
          }
        }

        return retval;
      }